

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

LY_ERR ly_ctx_new_ylmem(char *search_dir,char *data,LYD_FORMAT format,int options,ly_ctx **ctx)

{
  LY_ERR LVar1;
  char *pcVar2;
  lyd_node *data_yl;
  ly_ctx *ctx_yl;
  lyd_node *local_40;
  ly_ctx *local_38;
  
  local_38 = (ly_ctx *)0x0;
  local_40 = (lyd_node *)0x0;
  if (data == (char *)0x0) {
    pcVar2 = "data";
  }
  else {
    if (ctx != (ly_ctx **)0x0) {
      LVar1 = ly_ctx_new(search_dir,0,&local_38);
      if ((LVar1 == LY_SUCCESS) &&
         (LVar1 = lyd_parse_data_mem(local_38,data,format,0,2,&local_40), LVar1 == LY_SUCCESS)) {
        LVar1 = ly_ctx_new_yldata(search_dir,local_40,options,ctx);
      }
      lyd_free_all(local_40);
      ly_ctx_destroy(local_38);
      return LVar1;
    }
    pcVar2 = "ctx";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"ly_ctx_new_ylmem");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_ctx_new_ylmem(const char *search_dir, const char *data, LYD_FORMAT format, int options, struct ly_ctx **ctx)
{
    LY_ERR ret = LY_SUCCESS;
    struct ly_ctx *ctx_yl = NULL;
    struct lyd_node *data_yl = NULL;

    LY_CHECK_ARG_RET(NULL, data, ctx, LY_EINVAL);

    /* create a seperate context for the data */
    LY_CHECK_GOTO(ret = ly_ctx_new(search_dir, 0, &ctx_yl), cleanup);

    /* parse yang library data tree */
    LY_CHECK_GOTO(ret = lyd_parse_data_mem(ctx_yl, data, format, 0, LYD_VALIDATE_PRESENT, &data_yl), cleanup);

    /* create the new context */
    ret = ly_ctx_new_yldata(search_dir, data_yl, options, ctx);

cleanup:
    lyd_free_all(data_yl);
    ly_ctx_destroy(ctx_yl);
    return ret;
}